

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_abs_h(CPUTriCoreState *env,target_ulong_conflict arg)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar3 = 0x10;
  bVar4 = 0;
  uVar2 = 0;
  uVar5 = 0;
  uVar6 = 0;
  do {
    uVar7 = (int)(arg << ((byte)iVar3 & 0x1f)) >> 0x10;
    uVar1 = -uVar7;
    if (0 < (int)uVar7) {
      uVar1 = uVar7;
    }
    uVar6 = uVar6 | 0x7fff < uVar1;
    uVar5 = uVar5 | uVar1 * 2 ^ uVar1;
    uVar2 = uVar2 | uVar1 << (bVar4 & 0x1f);
    bVar4 = bVar4 + 0x10;
    iVar3 = iVar3 + -0x10;
  } while (iVar3 == 0);
  env->PSW_USB_V = uVar6 << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar6 << 0x1f;
  env->PSW_USB_AV = uVar5 << 0x10;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar5 << 0x10;
  return uVar2;
}

Assistant:

uint32_t helper_abs_h(CPUTriCoreState *env, target_ulong arg)
{
    int32_t h, i;
    int32_t ovf = 0;
    int32_t avf = 0;
    int32_t ret = 0;

    for (i = 0; i < 2; i++) {
        h = sextract32(arg, i * 16, 16);
        h = (h >= 0) ? h : (0 - h);
        ovf |= (h > 0x7FFF) || (h < -0x8000);
        avf |= h ^ h * 2u;
        ret |= (h & 0xffff) << (i * 16);
    }

    env->PSW_USB_V = ovf << 31;
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 16;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return ret;
}